

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpio.c
# Opt level: O0

void t8(void)

{
  undefined4 in_EAX;
  undefined4 uVar1;
  int iVar2;
  int v;
  int in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  undefined4 uVar3;
  char *pcVar4;
  
  printf("Bank read/write tests.\n");
  gpioWrite(0x19,0);
  uVar1 = gpioRead_Bits_0_31();
  pcVar4 = (char *)(CONCAT44(uVar1,in_EAX) & 0x2000000ffffffff);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,v,pcVar4);
  uVar3 = SUB84(pcVar4,0);
  gpioWrite(0x19,1);
  uVar1 = gpioRead_Bits_0_31();
  pcVar4 = (char *)(CONCAT44(uVar1,uVar3) & 0x2000000ffffffff);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,v,pcVar4);
  uVar3 = SUB84(pcVar4,0);
  gpioWrite_Bits_0_31_Clear(0x2000000);
  uVar1 = gpioRead(0x19);
  pcVar4 = (char *)CONCAT44(uVar1,uVar3);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,v,pcVar4);
  uVar3 = SUB84(pcVar4,0);
  gpioWrite_Bits_0_31_Set(0x2000000);
  uVar1 = gpioRead(0x19);
  pcVar4 = (char *)CONCAT44(uVar1,uVar3);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,v,pcVar4);
  iVar2 = gpioRead_Bits_32_53();
  if (iVar2 == 0) {
    pcVar4 = (char *)CONCAT44(1,(int)pcVar4);
  }
  else {
    pcVar4 = (char *)((ulong)pcVar4 & 0xffffffff);
  }
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,v,pcVar4);
  uVar3 = SUB84(pcVar4,0);
  uVar1 = gpioWrite_Bits_32_53_Clear(0);
  pcVar4 = (char *)CONCAT44(uVar1,uVar3);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,v,pcVar4);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,v,pcVar4);
  uVar3 = SUB84(pcVar4,0);
  uVar1 = gpioWrite_Bits_32_53_Set(0);
  pcVar4 = (char *)CONCAT44(uVar1,uVar3);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,v,pcVar4);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,v,pcVar4);
  return;
}

Assistant:

void t8()
{
   int v;

   printf("Bank read/write tests.\n");

   gpioWrite(GPIO, 0);
   v = gpioRead_Bits_0_31() & (1<<GPIO);
   CHECK(8, 1, v, 0, 0, "read bank 1");

   gpioWrite(GPIO, 1);
   v = gpioRead_Bits_0_31() & (1<<GPIO);
   CHECK(8, 2, v, (1<<GPIO), 0, "read bank 1");

   gpioWrite_Bits_0_31_Clear(1<<GPIO);
   v = gpioRead(GPIO);
   CHECK(8, 3, v, 0, 0, "clear bank 1");

   gpioWrite_Bits_0_31_Set(1<<GPIO);
   v = gpioRead(GPIO);
   CHECK(8, 4, v, 1, 0, "set bank 1");

   v = gpioRead_Bits_32_53();

   if (v) v = 0; else v = 1;

   CHECK(8, 5, v, 0, 0, "read bank 2");

   v = gpioWrite_Bits_32_53_Clear(0);
   CHECK(8, 6, v, 0, 0, "clear bank 2");

   CHECK(8, 7, 0, 0, 0, "NOT APPLICABLE");

   v = gpioWrite_Bits_32_53_Set(0);
   CHECK(8, 8, v, 0, 0, "set bank 2");

   CHECK(8, 9, 0, 0, 0, "NOT APPLICABLE");
}